

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerEvaluationTest.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  size_type *psVar1;
  long *plVar2;
  undefined8 *puVar3;
  ostream *poVar4;
  ulong *puVar5;
  long *plVar6;
  ulong uVar7;
  undefined8 uVar8;
  double __x;
  double __y;
  double dVar9;
  double __x_00;
  double __y_00;
  Variable x;
  Variable y;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  Variable local_118;
  PowerExpression local_100;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  Variable local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_100.super_BinaryExpression.super_BaseExpression._vptr_BaseExpression = (_func_int **)0x0;
  local_118._vptr_Variable = (_func_int **)&PTR_differentiate_0011d4e0;
  local_118.m_variableExpressionPtr.
  super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Kandinsky::VariableExpression,std::allocator<Kandinsky::VariableExpression>,double&>
            (&local_118.m_variableExpressionPtr.
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(VariableExpression **)&local_118.m_variableExpressionPtr,
             (allocator<Kandinsky::VariableExpression> *)&local_138,(double *)&local_100);
  local_100.super_BinaryExpression.super_BaseExpression._vptr_BaseExpression = (_func_int **)0x0;
  local_b8._vptr_Variable = (_func_int **)&PTR_differentiate_0011d4e0;
  local_b8.m_variableExpressionPtr.
  super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Kandinsky::VariableExpression,std::allocator<Kandinsky::VariableExpression>,double&>
            (&local_b8.m_variableExpressionPtr.
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(VariableExpression **)&local_b8.m_variableExpressionPtr,
             (allocator<Kandinsky::VariableExpression> *)&local_138,(double *)&local_100);
  (local_118.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       3.0;
  (local_b8.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       2.0;
  Kandinsky::pow<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>(&local_100,&local_118,&local_b8)
  ;
  (**(local_100.super_BinaryExpression.m_arg1.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  (**(local_100.super_BinaryExpression.m_arg2.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  dVar9 = pow(__x,__y);
  (**((local_118.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_40,vsnprintf,0x148,"%f");
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_c8 = *puVar5;
    lStack_c0 = plVar2[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar5;
    local_d8 = (ulong *)*plVar2;
  }
  local_d0 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  (**((local_b8.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_a0,vsnprintf,0x148,"%f");
  uVar7 = 0xf;
  if (local_d8 != &local_c8) {
    uVar7 = local_c8;
  }
  if (uVar7 < local_a0._M_string_length + local_d0) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      uVar8 = local_a0.field_2._M_allocated_capacity;
    }
    if (local_a0._M_string_length + local_d0 <= (ulong)uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_d8);
      goto LAB_0010f55f;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_a0._M_dataplus._M_p);
LAB_0010f55f:
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  psVar1 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_138.field_2._M_allocated_capacity = *psVar1;
    local_138.field_2._8_8_ = puVar3[3];
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar1;
    local_138._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_138._M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_138);
  plVar6 = plVar2 + 2;
  if ((long *)*plVar2 == plVar6) {
    local_50 = *plVar6;
    lStack_48 = plVar2[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar6;
    local_60 = (long *)*plVar2;
  }
  local_58 = plVar2[1];
  *plVar2 = (long)plVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((dVar9 != 9.0) || (NAN(dVar9))) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_60,local_58);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    if (local_60 != &local_50) {
      operator_delete(local_60);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    local_100.super_BinaryExpression.super_BaseExpression._vptr_BaseExpression =
         (_func_int **)&PTR___cxa_pure_virtual_0011d298;
    if (local_100.super_BinaryExpression.m_arg2.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.super_BinaryExpression.m_arg2.
                 super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_100.super_BinaryExpression.m_arg1.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.super_BinaryExpression.m_arg1.
                 super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_d8 = (ulong *)CONCAT44(local_d8._4_4_,2);
    Kandinsky::pow<Kandinsky::Variable,_int,_nullptr>(&local_100,&local_118,(int *)&local_d8);
    (**(local_100.super_BinaryExpression.m_arg1.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       _vptr_BaseExpression)();
    (**(local_100.super_BinaryExpression.m_arg2.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       _vptr_BaseExpression)();
    dVar9 = pow(__x_00,__y_00);
    (**((local_118.m_variableExpressionPtr.
         super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       super_BaseExpression)._vptr_BaseExpression)();
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_138,vsnprintf,0x148,"%f");
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_138);
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_70 = *plVar6;
      lStack_68 = plVar2[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar6;
      local_80 = (long *)*plVar2;
    }
    local_78 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((dVar9 == 9.0) && (!NAN(dVar9))) {
      if (local_80 != &local_70) {
        operator_delete(local_80);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      local_100.super_BinaryExpression.super_BaseExpression._vptr_BaseExpression =
           (_func_int **)&PTR___cxa_pure_virtual_0011d298;
      if (local_100.super_BinaryExpression.m_arg2.
          super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_100.super_BinaryExpression.m_arg2.
                   super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_100.super_BinaryExpression.m_arg1.
          super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_100.super_BinaryExpression.m_arg1.
                   super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_b8._vptr_Variable = (_func_int **)&PTR_differentiate_0011d4e0;
      if (local_b8.m_variableExpressionPtr.
          super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.m_variableExpressionPtr.
                   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_118._vptr_Variable = (_func_int **)&PTR_differentiate_0011d4e0;
      if (local_118.m_variableExpressionPtr.
          super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.m_variableExpressionPtr.
                   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      return 0;
    }
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_80,local_78);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  exit(1);
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    Variable y;
    x.setValue(3);
    y.setValue(2);
    assertOrExit(pow(x, y).evaluate() == 9, std::to_string(x.evaluate()) + " ^ " + std::to_string(y.evaluate()) + " != 9");
    assertOrExit(pow(x, 2).evaluate() == 9, std::to_string(x.evaluate()) + " ^ 2 != 9");
    return 0;
}